

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O3

int verify_stable(int **array,int64_t size,int num_values)

{
  int64_t i_1;
  long lVar1;
  int iVar2;
  int64_t i;
  long lVar3;
  
  if (0 < num_values) {
    lVar1 = 0;
    iVar2 = 0;
    lVar3 = 0;
LAB_0010c072:
    do {
      if (lVar3 < size) {
        do {
          if (*original[lVar3] == iVar2) goto LAB_0010c095;
          lVar3 = lVar3 + 1;
        } while (size != lVar3);
      }
      else {
LAB_0010c095:
        if (lVar3 != size) {
          if (lVar1 < size) {
            while (*array[lVar1] != iVar2) {
              lVar1 = lVar1 + 1;
              if (size == lVar1) {
                return 0;
              }
            }
          }
          if (lVar1 == size) {
            return 0;
          }
          if (original[lVar3] != array[lVar1]) {
            return 0;
          }
          lVar3 = lVar3 + 1;
          lVar1 = lVar1 + 1;
          goto LAB_0010c072;
        }
      }
      iVar2 = iVar2 + 1;
      lVar3 = size;
    } while (iVar2 != num_values);
  }
  return 1;
}

Assistant:

int verify_stable(int **array, int64_t size, int num_values) {
  int value;
  int64_t i = 0;
  int64_t j = 0;

  for (value = 0; value < num_values; value++) {
    while (1) {
      i = find_next(original, i, size, value);

      /* unlikely, but possible */
      if (i == size) {
        break;
      }

      j = find_next(array, j, size, value);

      if (j == size) {
        return 0;
      }

      if (original[i] != array[j]) {
        return 0;
      }

      i++;
      j++;
    }
  }

  return 1;
}